

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O2

int X509_STORE_CTX_get_by_subject(X509_STORE_CTX *vs,int type,X509_NAME *name,X509_OBJECT *ret)

{
  X509_STORE *pXVar1;
  OPENSSL_STACK *sk;
  code *pcVar2;
  int iVar3;
  X509_OBJECT *pXVar4;
  size_t sVar5;
  long *plVar6;
  size_t i;
  ulong i_00;
  X509_OBJECT *pXVar7;
  X509_OBJECT stmp;
  
  pXVar1 = vs->ctx;
  CRYPTO_MUTEX_lock_write(&pXVar1->objs_lock);
  sk = (OPENSSL_STACK *)pXVar1->objs;
  iVar3 = X509_OBJECT_idx_by_subject((stack_st_X509_OBJECT *)sk,type,(X509_NAME *)name);
  if (iVar3 == -1) {
    pXVar4 = (X509_OBJECT *)0x0;
  }
  else {
    pXVar4 = (X509_OBJECT *)OPENSSL_sk_value(sk,(long)iVar3);
  }
  CRYPTO_MUTEX_unlock_write(&pXVar1->objs_lock);
  pXVar7 = pXVar4;
  if (type == 2 || pXVar4 == (X509_OBJECT *)0x0) {
    pXVar7 = &stmp;
    for (i_00 = 0; sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar1->get_cert_methods), i_00 < sVar5;
        i_00 = i_00 + 1) {
      plVar6 = (long *)OPENSSL_sk_value((OPENSSL_STACK *)pXVar1->get_cert_methods,i_00);
      if (((*plVar6 != 0) && (pcVar2 = *(code **)(*plVar6 + 0x18), pcVar2 != (code *)0x0)) &&
         (iVar3 = (*pcVar2)(plVar6,type,name,pXVar7), 0 < iVar3)) goto LAB_0019e31c;
    }
    pXVar7 = pXVar4;
    if (pXVar4 == (X509_OBJECT *)0x0) {
      return 0;
    }
  }
LAB_0019e31c:
  ret->type = pXVar7->type;
  ret->data = pXVar7->data;
  X509_OBJECT_up_ref_count((X509_OBJECT *)ret);
  return 1;
}

Assistant:

int X509_STORE_CTX_get_by_subject(X509_STORE_CTX *vs, int type, X509_NAME *name,
                                  X509_OBJECT *ret) {
  X509_STORE *ctx = vs->ctx;
  X509_OBJECT stmp;
  CRYPTO_MUTEX_lock_write(&ctx->objs_lock);
  X509_OBJECT *tmp = X509_OBJECT_retrieve_by_subject(ctx->objs, type, name);
  CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);

  if (tmp == NULL || type == X509_LU_CRL) {
    for (size_t i = 0; i < sk_X509_LOOKUP_num(ctx->get_cert_methods); i++) {
      X509_LOOKUP *lu = sk_X509_LOOKUP_value(ctx->get_cert_methods, i);
      if (X509_LOOKUP_by_subject(lu, type, name, &stmp)) {
        tmp = &stmp;
        break;
      }
    }
    if (tmp == NULL) {
      return 0;
    }
  }

  // TODO(crbug.com/boringssl/685): This should call
  // |X509_OBJECT_free_contents|.
  ret->type = tmp->type;
  ret->data = tmp->data;
  X509_OBJECT_up_ref_count(ret);
  return 1;
}